

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<std::complex<double>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *rhs)

{
  double dVar1;
  _Head_base<0UL,_std::complex<double>_*,_false> __p;
  long lVar2;
  long lVar3;
  size_type_conflict sVar4;
  int64_t k;
  long lVar5;
  long lVar6;
  long lVar7;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> new_data;
  _Head_base<0UL,_std::complex<double>_*,_false> local_50;
  data_type *local_48;
  long local_40;
  long local_38;
  
  lVar6 = this->size_;
  if (lVar6 == rhs->size_) {
    init_unique_array<std::complex<double>>((dense *)&local_50,lVar6 * lVar6);
    local_48 = &this->data_;
    sVar4 = this->size_;
    local_40 = 0;
    for (lVar6 = 0; __p._M_head_impl = local_50._M_head_impl, lVar6 < sVar4; lVar6 = lVar6 + 1) {
      lVar3 = 0;
      while (lVar3 < sVar4) {
        lVar7 = 0;
        local_38 = lVar3;
        for (lVar5 = 0; lVar5 < sVar4; lVar5 = lVar5 + 1) {
          std::operator*((local_48->_M_t).
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                         sVar4 * lVar5 + lVar3,
                         (complex<double> *)
                         (((rhs->data_)._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->
                          _M_value + lVar7 + rhs->size_ * local_40));
          lVar2 = this->size_ * lVar6;
          dVar1 = *(double *)(local_50._M_head_impl[lVar3 + lVar2]._M_value + 8);
          *(double *)local_50._M_head_impl[lVar3 + lVar2]._M_value =
               extraout_XMM0_Qa + *(double *)local_50._M_head_impl[lVar3 + lVar2]._M_value;
          *(double *)(local_50._M_head_impl[lVar3 + lVar2]._M_value + 8) = in_XMM1_Qa + dVar1;
          sVar4 = this->size_;
          lVar7 = lVar7 + 0x10;
        }
        lVar3 = local_38 + 1;
      }
      local_40 = local_40 + 0x10;
    }
    local_50._M_head_impl = (complex<double> *)0x0;
    std::__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>::reset
              ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                *)local_48,__p._M_head_impl);
    std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
    ~unique_ptr((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
                &local_50);
    return this;
  }
  __assert_fail("size_ == rhs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0xb0,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<double>>::operator*=(const SquareMatrix<T> &) [T = std::complex<double>]"
               );
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }